

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

string * __thiscall
cmCTest::GetTestModelString_abi_cxx11_(string *__return_storage_ptr__,cmCTest *this)

{
  int iVar1;
  size_type sVar2;
  pointer pcVar3;
  char *pcVar4;
  char *pcVar5;
  
  sVar2 = (this->SpecificTrack)._M_string_length;
  if (sVar2 == 0) {
    iVar1 = this->TestModel;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (iVar1 == 2) {
      pcVar5 = "Continuous";
      pcVar4 = "";
    }
    else if (iVar1 == 1) {
      pcVar5 = "Nightly";
      pcVar4 = "";
    }
    else {
      pcVar5 = "Experimental";
      pcVar4 = "";
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar5,pcVar4);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (this->SpecificTrack)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + sVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::GetTestModelString()
{
  if ( !this->SpecificTrack.empty() )
    {
    return this->SpecificTrack;
    }
  switch ( this->TestModel )
    {
  case cmCTest::NIGHTLY:
    return "Nightly";
  case cmCTest::CONTINUOUS:
    return "Continuous";
    }
  return "Experimental";
}